

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

void __thiscall proto2_unittest::V1MessageLite::Clear(V1MessageLite *this)

{
  uint32_t *puVar1;
  uint32_t cached_has_bits;
  V1MessageLite *this_local;
  
  puVar1 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  if ((*puVar1 & 3) != 0) {
    (this->field_0)._impl_.int_field_ = 0;
    (this->field_0)._impl_.enum_field_ = 1;
  }
  google::protobuf::internal::HasBits<1>::Clear(&(this->field_0)._impl_._has_bits_);
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void V1MessageLite::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.V1MessageLite)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    _impl_.int_field_ = 0;
    _impl_.enum_field_ = 1;
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<std::string>();
}